

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_sptfqmr.c
# Opt level: O2

SUNErrCode SUNLinSolInitialize_SPTFQMR(SUNLinearSolver S)

{
  int *piVar1;
  
  piVar1 = (int *)S->content;
  if (*piVar1 < 1) {
    *piVar1 = 5;
  }
  if (2 < piVar1[1] - 1U) {
    piVar1[1] = 0;
  }
  return 0;
}

Assistant:

SUNErrCode SUNLinSolInitialize_SPTFQMR(SUNLinearSolver S)
{
  SUNFunctionBegin(S->sunctx);
  SUNLinearSolverContent_SPTFQMR content;

  /* set shortcut to SPTFQMR memory structure */
  content = SPTFQMR_CONTENT(S);

  /* ensure valid options */
  if (content->maxl <= 0) { content->maxl = SUNSPTFQMR_MAXL_DEFAULT; }

  SUNAssert(content->ATimes, SUN_ERR_ARG_CORRUPT);

  if ((content->pretype != SUN_PREC_LEFT) &&
      (content->pretype != SUN_PREC_RIGHT) && (content->pretype != SUN_PREC_BOTH))
  {
    content->pretype = SUN_PREC_NONE;
  }

  SUNAssert((content->pretype == SUN_PREC_NONE) || (content->Psolve != NULL),
            SUN_ERR_ARG_CORRUPT);

  /* no additional memory to allocate */

  return SUN_SUCCESS;
}